

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryMultiArea(Mio_Library_t *pLib,double Multi)

{
  double dVar1;
  Mio_Gate_t *local_20;
  Mio_Gate_t *pGate;
  double Multi_local;
  Mio_Library_t *pLib_local;
  
  for (local_20 = Mio_LibraryReadGates(pLib); local_20 != (Mio_Gate_t *)0x0;
      local_20 = Mio_GateReadNext(local_20)) {
    if (1 < local_20->nInputs) {
      dVar1 = pow((double)local_20->nInputs,Multi);
      local_20->dArea = dVar1 * local_20->dArea;
    }
  }
  return;
}

Assistant:

void Mio_LibraryMultiArea( Mio_Library_t * pLib, double Multi )
{
    Mio_Gate_t * pGate;
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs < 2 )
            continue;
//        printf( "Before %8.3f  ", pGate->dArea );
        pGate->dArea *= pow( pGate->nInputs, Multi );
//        printf( "After %8.3f  Inputs = %d. Factor = %8.3f\n", pGate->dArea, pGate->nInputs, pow( pGate->nInputs, Multi ) );
    }
}